

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S_function.cpp
# Opt level: O2

Sequence * __thiscall
S_function::operator()(Sequence *__return_storage_ptr__,S_function *this,Sequence *seq)

{
  int begin;
  long lVar1;
  long lVar2;
  bool bVar3;
  vector<Sequence,_std::allocator<Sequence>_> seqs;
  Sequence subseq;
  Sequence local_88;
  
  lVar1 = 8;
  std::vector<Sequence,_std::allocator<Sequence>_>::vector(&seqs,8,(allocator_type *)&subseq);
  lVar2 = 0x270;
  begin = 0;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    Sequence::subsequence(&subseq,seq,begin,begin + 6);
    Sbox::operator()(&local_88,this->m_sboxes[lVar1],&subseq);
    std::deque<int,_std::allocator<int>_>::_M_move_assign1
              ((deque<int,_std::allocator<int>_> *)
               ((long)&(seqs.super__Vector_base<Sequence,_std::allocator<Sequence>_>._M_impl.
                        super__Vector_impl_data._M_start)->_vptr_Sequence + lVar2),&local_88.m_bits)
    ;
    Sequence::~Sequence(&local_88);
    Sequence::~Sequence(&subseq);
    lVar2 = lVar2 + -0x58;
    begin = begin + 6;
  }
  std::__cxx11::list<Sequence,std::allocator<Sequence>>::
  list<__gnu_cxx::__normal_iterator<Sequence*,std::vector<Sequence,std::allocator<Sequence>>>,void>
            ((list<Sequence,std::allocator<Sequence>> *)&subseq,
             (__normal_iterator<Sequence_*,_std::vector<Sequence,_std::allocator<Sequence>_>_>)
             seqs.super__Vector_base<Sequence,_std::allocator<Sequence>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Sequence_*,_std::vector<Sequence,_std::allocator<Sequence>_>_>)
             seqs.super__Vector_base<Sequence,_std::allocator<Sequence>_>._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_88);
  Sequence::Sequence(__return_storage_ptr__,(list<Sequence,_std::allocator<Sequence>_> *)&subseq);
  std::__cxx11::_List_base<Sequence,_std::allocator<Sequence>_>::_M_clear
            ((_List_base<Sequence,_std::allocator<Sequence>_> *)&subseq);
  std::vector<Sequence,_std::allocator<Sequence>_>::~vector(&seqs);
  return __return_storage_ptr__;
}

Assistant:

Sequence S_function::operator()(Sequence &seq) {
    std::vector<Sequence> seqs(8);

    // For each subsequence of size 6, map input to output using Sboxes
    for (auto i = 0; i < 8; ++i) {
        Sequence subseq = seq.subsequence(i * 6, (i + 1) * 6);
        seqs[8 - i - 1] = (*m_sboxes[8 - i - 1])(subseq);
    }

    return Sequence({seqs.begin(), seqs.end()});
}